

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void * __thiscall MixedArena::allocSpace(MixedArena *this,size_t size,size_t align)

{
  pointer *pppvVar1;
  MixedArena *pMVar2;
  iterator __position;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  pthread_t pVar6;
  __pointer_type this_00;
  MixedArena *pMVar7;
  ulong uVar8;
  bool bVar9;
  void *local_40;
  ulong local_38;
  
  local_38 = size;
  do {
    pVar6 = pthread_self();
    uVar5 = local_38;
    if (pVar6 == (this->threadId)._M_thread) {
      uVar8 = -align & (this->index + align) - 1;
      this->index = uVar8;
      if ((0x8000 < uVar8 + local_38) ||
         ((this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start)) {
        if ((local_38 + 0x7fff & 0xffffffffffff8000) < local_38) {
          __assert_fail("size <= numChunks * CHUNK_SIZE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0x7e,"void *MixedArena::allocSpace(size_t, size_t)");
        }
        local_40 = (void *)aligned_alloc(0x10);
        if (local_40 == (void *)0x0) {
          abort();
        }
        __position._M_current =
             (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                    ((vector<void*,std::allocator<void*>> *)this,__position,&local_40);
        }
        else {
          *__position._M_current = local_40;
          pppvVar1 = &(this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppvVar1 = *pppvVar1 + 1;
        }
        this->index = 0;
      }
      sVar3 = this->index;
      pvVar4 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      this->index = uVar5 + sVar3;
      return (void *)((long)pvVar4 + sVar3);
    }
    this_00 = (__pointer_type)0x0;
    pMVar7 = this;
    do {
      this = pMVar7;
      if (pVar6 == (pMVar7->threadId)._M_thread) break;
      pMVar2 = (pMVar7->next)._M_b._M_p;
      this = pMVar2;
      if (pMVar2 == (MixedArena *)0x0) {
        if (this_00 == (__pointer_type)0x0) {
          this_00 = (__pointer_type)operator_new(0x30);
          (this_00->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (this_00->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (this_00->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_00->index = 0;
          (this_00->threadId)._M_thread = pVar6;
          LOCK();
          (this_00->next)._M_b._M_p = (__pointer_type)0x0;
          UNLOCK();
        }
        LOCK();
        this = (pMVar7->next)._M_b._M_p;
        bVar9 = this == (MixedArena *)0x0;
        if (bVar9) {
          (pMVar7->next)._M_b._M_p = this_00;
          this = pMVar2;
        }
        UNLOCK();
        if (!bVar9) goto LAB_00154f2f;
        bVar9 = true;
        this_00 = (__pointer_type)0x0;
        this = pMVar7;
      }
      else {
LAB_00154f2f:
        bVar9 = false;
      }
      pMVar7 = this;
    } while (!bVar9);
    if (this_00 != (MixedArena *)0x0) {
      ~MixedArena(this_00);
      operator_delete(this_00,0x30);
    }
  } while( true );
}

Assistant:

void* allocSpace(size_t size, size_t align) {
    // the bump allocator data should not be modified by multiple threads at
    // once.
    auto myId = std::this_thread::get_id();
    if (myId != threadId) {
      MixedArena* curr = this;
      MixedArena* allocated = nullptr;
      while (myId != curr->threadId) {
        auto seen = curr->next.load();
        if (seen) {
          curr = seen;
          continue;
        }
        // there is a nullptr for next, so we may be able to place a new
        // allocator for us there. but carefully, as others may do so as
        // well. we may waste a few allocations here, but it doesn't matter
        // as this can only happen as the chain is built up, i.e.,
        // O(# of cores) per allocator, and our allocatrs are long-lived.
        if (!allocated) {
          allocated = new MixedArena(); // has our thread id
        }
        if (curr->next.compare_exchange_strong(seen, allocated)) {
          // we replaced it, so we are the next in the chain
          // we can forget about allocated, it is owned by the chain now
          allocated = nullptr;
          break;
        }
        // otherwise, the cmpxchg updated seen, and we continue to loop
        curr = seen;
      }
      if (allocated) {
        delete allocated;
      }
      return curr->allocSpace(size, align);
    }
    // First, move the current index in the last chunk to an aligned position.
    index = (index + align - 1) & (-align);
    if (index + size > CHUNK_SIZE || chunks.size() == 0) {
      // Allocate a new chunk.
      auto numChunks = (size + CHUNK_SIZE - 1) / CHUNK_SIZE;
      assert(size <= numChunks * CHUNK_SIZE);
      auto* allocation =
        wasm::aligned_malloc(MAX_ALIGN, numChunks * CHUNK_SIZE);
      if (!allocation) {
        abort();
      }
      chunks.push_back(allocation);
      index = 0;
    }
    uint8_t* ret = static_cast<uint8_t*>(chunks.back());
    ret += index;
    index += size; // TODO: if we allocated more than 1 chunk, reuse the
                   // remainder, right now we allocate another next time
    return static_cast<void*>(ret);
  }